

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * __thiscall
lest::make_tuple_string<std::tuple<char,int,double,char_const*>,3ul>::make_abi_cxx11_
          (string *__return_storage_ptr__,
          make_tuple_string<std::tuple<char,int,double,char_const*>,3ul> *this,
          tuple<char,_int,_double,_const_char_*> *tuple)

{
  ostream *poVar1;
  tuple<char,_int,_double,_const_char_*> *tuple_00;
  ostringstream os;
  _Alloc_hider in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  to_string_abi_cxx11_((double)in_stack_fffffffffffffe38._M_p);
  poVar1 = std::operator<<((ostream *)local_188,(string *)&stack0xfffffffffffffe38);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
  make_tuple_string<std::tuple<char,int,double,char_const*>,2ul>::make_abi_cxx11_
            ((string *)&stack0xfffffffffffffe38,
             (make_tuple_string<std::tuple<char,int,double,char_const*>,2ul> *)this,tuple_00);
  std::__cxx11::stringbuf::str();
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffe38,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __return_storage_ptr__;
}

Assistant:

static std::string make( TU const & tuple )
    {
        std::ostringstream os;
        os << to_string( std::get<N - 1>( tuple ) ) << ( N < std::tuple_size<TU>::value ? ", ": " ");
        return make_tuple_string<TU, N - 1>::make( tuple ) + os.str();
    }